

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O0

bool __thiscall
gmlc::containers::BlockIterator<helics::FedInfo_const,32,helics::FedInfo_const*const*>::
checkEquivalence<helics::FedInfo**>
          (BlockIterator<helics::FedInfo_const,32,helics::FedInfo_const*const*> *this,
          FedInfo **testv,int testoffset)

{
  bool local_21;
  int testoffset_local;
  FedInfo **testv_local;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *this_local;
  
  if ((testv == *(FedInfo ***)this) ||
     ((((local_21 = false, testv != (FedInfo **)0x0 && (local_21 = false, *testv == (FedInfo *)0x0))
       && (local_21 = false, *(long *)this != 0)) && (local_21 = false, **(long **)this == 0)))) {
    local_21 = testoffset == *(int *)(this + 0x10);
  }
  return local_21;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }